

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::Disk::getPrimBounds(Disk *this,size_t param_2,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar9;
  undefined4 uVar17;
  box3f *in_RDI;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  undefined1 auVar66 [16];
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar71 [16];
  
  fVar40 = this->height;
  fVar50 = (this->transform).l.vx.x;
  fVar22 = (xfm->l).vx.z;
  uVar1 = (this->transform).l.vx.y;
  uVar10 = (this->transform).l.vx.z;
  fVar43 = (xfm->l).vy.z;
  fVar63 = (xfm->l).vz.z;
  fVar62 = (float)uVar10 * fVar63 + fVar50 * fVar22 + (float)uVar1 * fVar43;
  fVar18 = (this->transform).l.vy.x;
  uVar2 = (this->transform).l.vy.y;
  uVar11 = (this->transform).l.vy.z;
  fVar36 = fVar63 * (float)uVar11 + fVar22 * fVar18 + fVar43 * (float)uVar2;
  fVar21 = (this->transform).l.vz.x;
  uVar3 = (this->transform).l.vz.y;
  uVar12 = (this->transform).l.vz.z;
  fVar29 = fVar63 * (float)uVar12 + fVar22 * fVar21 + fVar43 * (float)uVar3;
  uVar4 = (this->transform).p.x;
  uVar13 = (this->transform).p.y;
  fVar45 = (xfm->p).z;
  (in_RDI->lower).x = 3.4028235e+38;
  (in_RDI->lower).y = 3.4028235e+38;
  *(undefined8 *)&(in_RDI->lower).z = 0xff7fffff7f7fffff;
  (in_RDI->upper).y = -3.4028235e+38;
  (in_RDI->upper).z = -3.4028235e+38;
  uVar5 = (xfm->l).vx.x;
  uVar14 = (xfm->l).vx.y;
  uVar6 = (xfm->l).vy.x;
  uVar15 = (xfm->l).vy.y;
  uVar7 = (xfm->l).vz.x;
  uVar16 = (xfm->l).vz.y;
  fVar57 = (float)uVar10 * (float)uVar7 + (float)uVar1 * (float)uVar6 + fVar50 * (float)uVar5;
  fVar59 = (float)uVar10 * (float)uVar16 + (float)uVar1 * (float)uVar15 + fVar50 * (float)uVar14;
  fVar60 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar50 * 0.0;
  fVar61 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar50 * 0.0;
  fVar69 = (float)uVar11 * (float)uVar7 + (float)uVar2 * (float)uVar6 + fVar18 * (float)uVar5;
  fVar72 = (float)uVar11 * (float)uVar16 + (float)uVar2 * (float)uVar15 + fVar18 * (float)uVar14;
  fVar74 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar18 * 0.0;
  fVar76 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar18 * 0.0;
  fVar46 = (float)uVar12 * (float)uVar7 + (float)uVar3 * (float)uVar6 + fVar21 * (float)uVar5;
  fVar48 = (float)uVar12 * (float)uVar16 + (float)uVar3 * (float)uVar15 + fVar21 * (float)uVar14;
  fVar49 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar21 * 0.0;
  fVar50 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar21 * 0.0;
  fVar58 = fVar29 * 0.0;
  fVar21 = fVar46 * 0.0;
  fVar26 = fVar48 * 0.0;
  fVar27 = fVar49 * 0.0;
  fVar28 = fVar50 * 0.0;
  fVar29 = fVar29 * fVar40;
  fVar46 = fVar40 * fVar46;
  fVar48 = fVar40 * fVar48;
  fVar49 = fVar40 * fVar49;
  fVar40 = fVar40 * fVar50;
  uVar9 = *(undefined8 *)&(this->transform).p.z;
  fVar52 = (float)uVar9;
  fVar51 = (float)((ulong)uVar9 >> 0x20);
  fVar64 = fVar51 * fVar36;
  fVar44 = fVar62 * fVar51;
  uVar8 = (xfm->p).x;
  uVar17 = (xfm->p).y;
  fVar53 = fVar52 * (float)uVar7 + (float)uVar13 * (float)uVar6 + (float)uVar4 * (float)uVar5 +
           (float)uVar8;
  fVar54 = fVar52 * (float)uVar16 + (float)uVar13 * (float)uVar15 + (float)uVar4 * (float)uVar14 +
           (float)uVar17;
  fVar55 = fVar52 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar56 = fVar52 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar18 = -fVar51;
  fVar62 = fVar62 * fVar18;
  fVar36 = fVar36 * fVar18;
  fVar70 = fVar57 * fVar18;
  fVar73 = fVar59 * fVar18;
  fVar75 = fVar60 * fVar18;
  fVar77 = fVar61 * fVar18;
  fVar65 = fVar18 * fVar69;
  fVar67 = fVar18 * fVar72;
  fVar68 = fVar18 * fVar74;
  fVar18 = fVar18 * fVar76;
  fVar50 = fVar70 + fVar65;
  fVar33 = fVar73 + fVar67;
  fVar34 = fVar75 + fVar68;
  fVar35 = fVar77 + fVar18;
  auVar37._0_8_ = CONCAT44(fVar33 + fVar26 + fVar54,fVar50 + fVar21 + fVar53);
  auVar37._8_4_ = fVar34 + fVar27 + fVar55;
  auVar37._12_4_ = fVar35 + fVar28 + fVar56;
  auVar23._8_4_ = auVar37._8_4_;
  auVar23._0_8_ = auVar37._0_8_;
  auVar23._12_4_ = auVar37._12_4_;
  auVar37 = maxps(auVar37,_DAT_00160270);
  auVar23 = minps(auVar23,_DAT_00161b30);
  auVar30._0_8_ = CONCAT44(fVar33 + fVar48 + fVar54,fVar50 + fVar46 + fVar53);
  auVar30._8_4_ = fVar34 + fVar49 + fVar55;
  auVar30._12_4_ = fVar35 + fVar40 + fVar56;
  auVar41._8_4_ = auVar30._8_4_;
  auVar41._0_8_ = auVar30._0_8_;
  auVar41._12_4_ = auVar30._12_4_;
  auVar23 = minps(auVar41,auVar23);
  fVar33 = fVar64 + fVar62;
  fVar62 = fVar62 + fVar36;
  fVar64 = fVar64 + fVar44;
  fVar45 = fVar45 + fVar43 * (float)uVar13 + fVar22 * (float)uVar4 + fVar63 * fVar52;
  fVar22 = fVar62 + fVar58 + fVar45;
  fVar50 = fVar22;
  if (3.4028235e+38 <= fVar22) {
    fVar50 = 3.4028235e+38;
  }
  fVar63 = fVar62 + fVar29 + fVar45;
  fVar43 = fVar63;
  if (fVar50 <= fVar63) {
    fVar43 = fVar50;
  }
  auVar30 = maxps(auVar30,auVar37);
  if (fVar22 <= -3.4028235e+38) {
    fVar22 = -3.4028235e+38;
  }
  if (fVar63 <= fVar22) {
    fVar63 = fVar22;
  }
  fVar69 = fVar69 * fVar51;
  fVar72 = fVar72 * fVar51;
  fVar74 = fVar74 * fVar51;
  fVar76 = fVar76 * fVar51;
  fVar70 = fVar70 + fVar69;
  fVar73 = fVar73 + fVar72;
  fVar75 = fVar75 + fVar74;
  fVar77 = fVar77 + fVar76;
  auVar19._0_8_ = CONCAT44(fVar73 + fVar26 + fVar54,fVar70 + fVar21 + fVar53);
  auVar19._8_4_ = fVar75 + fVar27 + fVar55;
  auVar19._12_4_ = fVar77 + fVar28 + fVar56;
  auVar24._8_4_ = auVar19._8_4_;
  auVar24._0_8_ = auVar19._0_8_;
  auVar24._12_4_ = auVar19._12_4_;
  auVar23 = minps(auVar24,auVar23);
  fVar50 = fVar33 + fVar58 + fVar45;
  fVar22 = fVar50;
  if (fVar43 <= fVar50) {
    fVar22 = fVar43;
  }
  auVar30 = maxps(auVar19,auVar30);
  if (fVar50 <= fVar63) {
    fVar50 = fVar63;
  }
  auVar71._0_8_ = CONCAT44(fVar73 + fVar48 + fVar54,fVar70 + fVar46 + fVar53);
  auVar71._8_4_ = fVar75 + fVar49 + fVar55;
  auVar71._12_4_ = fVar77 + fVar40 + fVar56;
  auVar31._8_4_ = auVar71._8_4_;
  auVar31._0_8_ = auVar71._0_8_;
  auVar31._12_4_ = auVar71._12_4_;
  auVar23 = minps(auVar31,auVar23);
  fVar63 = fVar33 + fVar29 + fVar45;
  fVar43 = fVar63;
  if (fVar22 <= fVar63) {
    fVar43 = fVar22;
  }
  auVar30 = maxps(auVar71,auVar30);
  if (fVar63 <= fVar50) {
    fVar63 = fVar50;
  }
  fVar44 = fVar44 + fVar36;
  fVar57 = fVar51 * fVar57;
  fVar59 = fVar51 * fVar59;
  fVar60 = fVar51 * fVar60;
  fVar51 = fVar51 * fVar61;
  fVar65 = fVar65 + fVar57;
  fVar67 = fVar67 + fVar59;
  fVar68 = fVar68 + fVar60;
  fVar18 = fVar18 + fVar51;
  auVar20._0_8_ = CONCAT44(fVar67 + fVar26 + fVar54,fVar65 + fVar21 + fVar53);
  auVar20._8_4_ = fVar68 + fVar27 + fVar55;
  auVar20._12_4_ = fVar18 + fVar28 + fVar56;
  auVar38._8_4_ = auVar20._8_4_;
  auVar38._0_8_ = auVar20._0_8_;
  auVar38._12_4_ = auVar20._12_4_;
  auVar23 = minps(auVar38,auVar23);
  fVar22 = fVar58 + fVar44 + fVar45;
  fVar50 = fVar22;
  if (fVar43 <= fVar22) {
    fVar50 = fVar43;
  }
  auVar30 = maxps(auVar20,auVar30);
  if (fVar22 <= fVar63) {
    fVar22 = fVar63;
  }
  fVar43 = fVar44 + fVar29 + fVar45;
  auVar66._0_8_ = CONCAT44(fVar67 + fVar48 + fVar54,fVar65 + fVar46 + fVar53);
  auVar66._8_4_ = fVar68 + fVar49 + fVar55;
  auVar66._12_4_ = fVar18 + fVar40 + fVar56;
  auVar25._8_4_ = auVar66._8_4_;
  auVar25._0_8_ = auVar66._0_8_;
  auVar25._12_4_ = auVar66._12_4_;
  auVar23 = minps(auVar25,auVar23);
  fVar63 = fVar43;
  if (fVar50 <= fVar43) {
    fVar63 = fVar50;
  }
  auVar30 = maxps(auVar66,auVar30);
  if (fVar43 <= fVar22) {
    fVar43 = fVar22;
  }
  fVar50 = fVar58 + fVar64 + fVar45;
  fVar57 = fVar57 + fVar69;
  fVar59 = fVar59 + fVar72;
  fVar60 = fVar60 + fVar74;
  fVar51 = fVar51 + fVar76;
  auVar42._0_8_ = CONCAT44(fVar26 + fVar59 + fVar54,fVar21 + fVar57 + fVar53);
  auVar42._8_4_ = fVar27 + fVar60 + fVar55;
  auVar42._12_4_ = fVar28 + fVar51 + fVar56;
  auVar32._8_4_ = auVar42._8_4_;
  auVar32._0_8_ = auVar42._0_8_;
  auVar32._12_4_ = auVar42._12_4_;
  auVar23 = minps(auVar32,auVar23);
  fVar22 = fVar50;
  if (fVar63 <= fVar50) {
    fVar22 = fVar63;
  }
  auVar30 = maxps(auVar42,auVar30);
  if (fVar50 <= fVar43) {
    fVar50 = fVar43;
  }
  fVar45 = fVar64 + fVar29 + fVar45;
  auVar47._0_8_ = CONCAT44(fVar59 + fVar48 + fVar54,fVar57 + fVar46 + fVar53);
  auVar47._8_4_ = fVar60 + fVar49 + fVar55;
  auVar47._12_4_ = fVar51 + fVar40 + fVar56;
  auVar39._8_4_ = auVar47._8_4_;
  auVar39._0_8_ = auVar47._0_8_;
  auVar39._12_4_ = auVar47._12_4_;
  auVar23 = minps(auVar39,auVar23);
  fVar40 = fVar45;
  if (fVar22 <= fVar45) {
    fVar40 = fVar22;
  }
  (in_RDI->lower).x = (float)(int)auVar23._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (in_RDI->lower).z = fVar40;
  auVar23 = maxps(auVar47,auVar30);
  if (fVar45 <= fVar50) {
    fVar45 = fVar50;
  }
  (in_RDI->upper).x = (float)(int)auVar23._0_8_;
  (in_RDI->upper).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (in_RDI->upper).z = fVar45;
  return in_RDI;
}

Assistant:

box3f Disk::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius,-radius,0),vec3f(+radius,+radius,height));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }